

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

uint P_GetPortal(int type,int plane,sector_t_conflict *from,sector_t_conflict *to,
                DVector2 *displacement)

{
  uint uVar1;
  FSectorPortal *pFVar2;
  double local_58;
  uint i;
  DVector2 *displacement_local;
  sector_t_conflict *to_local;
  sector_t_conflict *from_local;
  int plane_local;
  int type_local;
  
  uVar1 = TArray<FSectorPortal,_FSectorPortal>::Reserve(&sectorPortals,1);
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  memset(pFVar2,0,0x40);
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  pFVar2->mType = type;
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  pFVar2->mPlane = plane;
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  pFVar2->mOrigin = (sector_t *)from;
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  pFVar2->mDestination = (sector_t *)to;
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  TVector2<double>::operator=(&pFVar2->mDisplacement,displacement);
  if (type == 3) {
    local_58 = sector_t::GetPlaneTexZ((sector_t *)from,plane);
  }
  else {
    local_58 = 3.4028234663852886e+38;
  }
  pFVar2 = TArray<FSectorPortal,_FSectorPortal>::operator[](&sectorPortals,(ulong)uVar1);
  pFVar2->mPlaneZ = local_58;
  return uVar1;
}

Assistant:

unsigned P_GetPortal(int type, int plane, sector_t *from, sector_t *to, const DVector2 &displacement)
{
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = type;
	sectorPortals[i].mPlane = plane;
	sectorPortals[i].mOrigin = from;
	sectorPortals[i].mDestination = to;
	sectorPortals[i].mDisplacement = displacement;
	sectorPortals[i].mPlaneZ = type == PORTS_LINKEDPORTAL? from->GetPlaneTexZ(plane) : FLT_MAX;
	return i;
}